

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Block * __thiscall spv::Builder::makeNewBlock(Builder *this)

{
  Function *parent;
  Block *this_00;
  Id id;
  
  parent = this->buildPoint->parent;
  this_00 = (Block *)::operator_new(0x90);
  id = this->uniqueId + 1;
  this->uniqueId = id;
  Block::Block(this_00,id,parent);
  spv::Function::addBlock(parent,this_00);
  return this_00;
}

Assistant:

Block& Builder::makeNewBlock()
{
    Function& function = buildPoint->getParent();
    auto block = new Block(getUniqueId(), function);
    function.addBlock(block);
    return *block;
}